

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O3

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_normal
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,FaceHandle _fh,Vec3f *_normal)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BasePropHandleT<OpenMesh::VectorT<double,_3>_> _h;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar4;
  
  _h.super_BaseHandle.idx_ =
       (BaseHandle)
       (this->mesh_->super_Mesh).
       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
       .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
       face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.idx_;
  if (_h.super_BaseHandle.idx_ != -1) {
    fVar1 = (_normal->super_VectorDataT<float,_3>).values_[0];
    fVar2 = (_normal->super_VectorDataT<float,_3>).values_[1];
    fVar3 = (_normal->super_VectorDataT<float,_3>).values_[2];
    this_00 = PropertyContainer::property<OpenMesh::VectorT<double,3>>
                        ((PropertyContainer *)
                         &(this->mesh_->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .field_0x68,_h);
    pvVar4 = PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                       (this_00,(int)_fh.super_BaseHandle.idx_);
    (pvVar4->super_VectorDataT<double,_3>).values_[0] = (double)fVar1;
    (pvVar4->super_VectorDataT<double,_3>).values_[1] = (double)fVar2;
    (pvVar4->super_VectorDataT<double,_3>).values_[2] = (double)fVar3;
  }
  return;
}

Assistant:

virtual void set_normal(FaceHandle _fh, const Vec3f& _normal)
  {
    if (mesh_.has_face_normals())
      mesh_.set_normal(_fh, vector_cast<Normal>(_normal));
  }